

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::Descriptor> *this,Descriptor *lhs,Descriptor *rhs)

{
  ushort *puVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  if ((Descriptor *)this != lhs) {
    __x._M_len = (ulong)**(ushort **)(this + 0x10);
    puVar1 = (ushort *)(lhs->all_names_).payload_;
    __y._M_len = (ulong)*puVar1;
    __y._M_str = (char *)((long)puVar1 + ~__y._M_len);
    __x._M_str = (char *)(~__x._M_len + (long)*(ushort **)(this + 0x10));
    bVar2 = std::operator==(__x,__y);
    return bVar2;
  }
  return true;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }